

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chartype.c
# Opt level: O2

ssize_t ct_encode_char(char *dst,size_t len,wchar_t c)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = ct_enc_width(c);
  if (len < sVar2) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    uVar1 = wctomb(dst,c);
    if ((int)uVar1 < 0) {
      uVar3 = 0;
      wctomb((char *)0x0,L'\0');
    }
    else {
      uVar3 = (ulong)uVar1;
    }
  }
  return uVar3;
}

Assistant:

libedit_private ssize_t
ct_encode_char(char *dst, size_t len, wchar_t c)
{
	ssize_t l = 0;
	if (len < ct_enc_width(c))
		return -1;
	l = wctomb(dst, c);

	if (l < 0) {
		wctomb(NULL, L'\0');
		l = 0;
	}
	return l;
}